

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O1

bool duckdb::SubqueryDependentFilter(Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  bool bVar2;
  BoundConjunctionExpression *pBVar3;
  type pEVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this;
  bool bVar5;
  
  if (((expr->super_BaseExpression).expression_class == BOUND_CONJUNCTION) &&
     ((expr->super_BaseExpression).type == CONJUNCTION_AND)) {
    pBVar3 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>(&expr->super_BaseExpression);
    this = (pBVar3->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pBVar3->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = this == puVar1;
    if (!bVar5) {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this);
      bVar2 = SubqueryDependentFilter(pEVar4);
      while (!bVar2) {
        this = this + 1;
        bVar5 = this == puVar1;
        if (bVar5) goto LAB_00cb2c7c;
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this);
        bVar2 = SubqueryDependentFilter(pEVar4);
      }
      if (!bVar5) {
        return true;
      }
    }
  }
LAB_00cb2c7c:
  return (expr->super_BaseExpression).expression_class == BOUND_SUBQUERY;
}

Assistant:

bool SubqueryDependentFilter(Expression &expr) {
	if (expr.GetExpressionClass() == ExpressionClass::BOUND_CONJUNCTION &&
	    expr.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		auto &bound_conjunction = expr.Cast<BoundConjunctionExpression>();
		for (auto &child : bound_conjunction.children) {
			if (SubqueryDependentFilter(*child)) {
				return true;
			}
		}
	}
	if (expr.GetExpressionClass() == ExpressionClass::BOUND_SUBQUERY) {
		return true;
	}
	return false;
}